

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Pooling_x86::forward(Pooling_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  _func_int *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  undefined1 (*pauVar6) [16];
  Option *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  Pooling *in_RDI;
  bool bVar7;
  float fVar8;
  undefined1 auVar9 [16];
  int stride;
  __m128 _avg_2;
  __m128 _val_4;
  int k_1;
  __m128 _sum_2;
  float *sptr_1;
  int j_3;
  int i_5;
  __m128 _inv_maxk;
  float *outptr_4;
  Mat m_8;
  int q_4;
  __m128 _avg_1;
  __m128 _inv_area;
  __m128 _val_3;
  int sx;
  int kj;
  int sy;
  int ki;
  int area;
  __m128 _sum_1;
  int sx0;
  int j_2;
  int sy0;
  int i_4;
  float *outptr_3;
  Mat m_5;
  int q_3;
  int htailpad;
  int wtailpad;
  __m128 _val_2;
  int k;
  __m128 _max_1;
  float *sptr;
  int j_1;
  int i_3;
  float *outptr_2;
  Mat m_2;
  int q_2;
  int j;
  int i_2;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  float *outptr_1;
  __m128 _avg;
  __m128 _inv_size;
  __m128 _val_1;
  int i_1;
  __m128 _sum;
  float *ptr_1;
  int q_1;
  float *outptr;
  __m128 _val;
  int i;
  __m128 _max;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  int elempack;
  Mat *m_1;
  Mat *m;
  Mat *m_10;
  Mat *m_9;
  Mat *m_7;
  Mat *m_6;
  Mat *m_4;
  Mat *m_3;
  allocator_type *in_stack_ffffffffffffeeb0;
  undefined4 in_stack_ffffffffffffeeb8;
  int in_stack_ffffffffffffeebc;
  undefined4 in_stack_ffffffffffffeec0;
  int in_stack_ffffffffffffeec4;
  int in_stack_ffffffffffffeec8;
  int in_stack_ffffffffffffeecc;
  undefined4 in_stack_ffffffffffffeed0;
  undefined4 in_stack_ffffffffffffeed4;
  Allocator *in_stack_ffffffffffffef30;
  Option *in_stack_fffffffffffff010;
  undefined1 in_stack_fffffffffffff018 [16];
  Pooling *in_stack_fffffffffffff028;
  Option *in_stack_fffffffffffff038;
  Mat *in_stack_fffffffffffff040;
  Mat *in_stack_fffffffffffff048;
  bool local_f31;
  int local_e8c;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  int local_e70;
  int local_e6c;
  Option *in_stack_fffffffffffff1b8;
  Mat *in_stack_fffffffffffff1c0;
  Mat *in_stack_fffffffffffff1c8;
  void *local_e10;
  undefined8 local_e08;
  undefined8 local_e00;
  undefined8 local_df8;
  undefined4 local_df0;
  long *local_de8;
  undefined4 local_de0;
  undefined4 local_ddc;
  undefined4 local_dd8;
  undefined4 local_dd4;
  undefined4 local_dd0;
  undefined8 local_dc8;
  int local_dbc;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  int local_d7c;
  int local_d78;
  int local_d74;
  int local_d70;
  int local_d6c;
  undefined8 local_d68;
  undefined8 uStack_d60;
  int local_d50;
  int local_d4c;
  int local_d48;
  int local_d44;
  undefined8 local_d40;
  undefined8 local_d38;
  undefined8 local_d30;
  undefined4 local_d28;
  Allocator *local_d20;
  undefined4 local_d18;
  undefined4 local_d14;
  undefined4 local_d10;
  undefined4 local_d0c;
  undefined4 local_d08;
  undefined8 local_d00;
  void *local_cf8;
  undefined8 local_cf0;
  undefined8 local_ce8;
  undefined8 local_ce0;
  undefined4 local_cd8;
  long *local_cd0;
  undefined4 local_cc8;
  undefined4 local_cc4;
  undefined4 local_cc0;
  undefined4 local_cbc;
  undefined4 local_cb8;
  undefined8 local_cb0;
  int local_ca4;
  int local_ca0;
  int local_c9c;
  undefined8 local_c98;
  undefined8 uStack_c90;
  int local_c7c;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 *local_c60;
  int local_c58;
  int local_c54;
  undefined8 local_c50;
  undefined8 local_c48;
  undefined8 local_c40;
  undefined4 local_c38;
  Allocator *local_c30;
  undefined4 local_c28;
  undefined4 local_c24;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined8 local_c10;
  void *local_c08;
  undefined8 local_c00;
  undefined8 local_bf8;
  undefined8 local_bf0;
  undefined4 local_be8;
  long *local_be0;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined4 local_bd0;
  undefined4 local_bcc;
  undefined4 local_bc8;
  undefined8 local_bc0;
  int local_bb8;
  int local_bb4;
  int local_bb0;
  int local_bac;
  int local_ba8;
  int local_ba4;
  reference local_ba0;
  vector<int,_std::allocator<int>_> local_b90;
  int local_b78;
  int local_b74;
  int local_b70;
  undefined4 local_b6c;
  void *local_b68;
  int *local_b60;
  long local_b58;
  undefined4 local_b50;
  long *local_b48;
  undefined4 local_b40;
  int local_b3c;
  int local_b38;
  undefined4 local_b34;
  int local_b30;
  long local_b28;
  int local_adc;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  undefined8 *local_a80;
  int local_a74;
  int local_a4c;
  undefined1 local_a48 [16];
  undefined1 (*local_9d8) [16];
  int local_9d0;
  size_t local_9c8;
  int local_9c0;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  int local_98c;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  
  if (*(int *)((long)&in_RDI->adaptive_pooling + (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 0)
  {
    local_9b4 = in_RSI->elempack;
    local_9b8 = in_RSI->w;
    local_9bc = in_RSI->h;
    local_9c0 = in_RSI->c;
    local_9c8 = in_RSI->elemsize;
    if (local_9b4 == 4) {
      if (*(int *)((long)&in_RDI->global_pooling + (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 0
         ) {
        local_b68 = (void *)0x0;
        local_b60 = (int *)0x0;
        local_b58 = 0;
        local_b50 = 0;
        local_b48 = (long *)0x0;
        local_b40 = 0;
        local_b3c = 0;
        local_b38 = 0;
        local_b34 = 0;
        local_b30 = 0;
        local_b28 = 0;
        Pooling::make_padding
                  (in_stack_fffffffffffff028,in_stack_fffffffffffff018._8_8_,
                   in_stack_fffffffffffff018._0_8_,in_stack_fffffffffffff010);
        local_f31 = local_b68 == (void *)0x0 || local_b28 * local_b30 == 0;
        if (local_f31) {
          local_98c = -100;
          local_b6c = 1;
        }
        else {
          local_9b8 = local_b3c;
          local_9bc = local_b38;
          p_Var2 = (in_RDI->super_Layer)._vptr_Layer[-3];
          local_b70 = (local_b3c - *(int *)((long)&in_RDI->kernel_w + (long)p_Var2)) /
                      *(int *)((long)&in_RDI->stride_w + (long)p_Var2) + 1;
          p_Var2 = (in_RDI->super_Layer)._vptr_Layer[-3];
          local_b74 = (local_b38 - *(int *)((long)&in_RDI->kernel_h + (long)p_Var2)) /
                      *(int *)((long)&in_RDI->stride_h + (long)p_Var2) + 1;
          Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                      in_stack_ffffffffffffeecc,in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec4,
                      CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                      (int)((ulong)in_stack_ffffffffffffeeb0 >> 0x20),in_stack_ffffffffffffef30);
          bVar7 = true;
          if (in_RDX->data != (void *)0x0) {
            bVar7 = in_RDX->cstep * (long)in_RDX->c == 0;
          }
          if (bVar7) {
            local_98c = -100;
            local_b6c = 1;
          }
          else {
            p_Var2 = (in_RDI->super_Layer)._vptr_Layer[-3];
            local_b78 = *(int *)((long)&in_RDI->kernel_w + (long)p_Var2) *
                        *(int *)((long)&in_RDI->kernel_h + (long)p_Var2);
            std::allocator<int>::allocator((allocator<int> *)0x1048f77);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                       CONCAT44(in_stack_ffffffffffffeebc,in_stack_ffffffffffffeeb8),
                       in_stack_ffffffffffffeeb0);
            std::allocator<int>::~allocator((allocator<int> *)0x1048fa3);
            local_ba0 = std::vector<int,_std::allocator<int>_>::operator[](&local_b90,0);
            local_ba4 = 0;
            local_ba8 = 0;
            local_bac = local_9b8 -
                        *(int *)((long)&in_RDI->kernel_w +
                                (long)(in_RDI->super_Layer)._vptr_Layer[-3]);
            for (local_bb0 = 0;
                local_bb0 <
                *(int *)((long)&in_RDI->kernel_h + (long)(in_RDI->super_Layer)._vptr_Layer[-3]);
                local_bb0 = local_bb0 + 1) {
              for (local_bb4 = 0;
                  local_bb4 <
                  *(int *)((long)&in_RDI->kernel_w + (long)(in_RDI->super_Layer)._vptr_Layer[-3]);
                  local_bb4 = local_bb4 + 1) {
                local_ba0[local_ba4] = local_ba8;
                local_ba4 = local_ba4 + 1;
                local_ba8 = local_ba8 + 1;
              }
              local_ba8 = local_bac + local_ba8;
            }
            if (*(int *)((long)&in_RDI->pooling_type + (long)(in_RDI->super_Layer)._vptr_Layer[-3])
                == 0) {
              if (((*(int *)((long)&in_RDI->kernel_w + (long)(in_RDI->super_Layer)._vptr_Layer[-3])
                    == 2) &&
                  (*(int *)((long)&in_RDI->kernel_h + (long)(in_RDI->super_Layer)._vptr_Layer[-3])
                   == 2)) &&
                 ((*(int *)((long)&in_RDI->stride_w + (long)(in_RDI->super_Layer)._vptr_Layer[-3])
                   == 2 && (*(int *)((long)&in_RDI->stride_h +
                                    (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 2)))) {
                pooling2x2s2_max_pack4_sse
                          (in_stack_fffffffffffff048,in_stack_fffffffffffff040,
                           in_stack_fffffffffffff038);
              }
              else if (((*(int *)((long)&in_RDI->kernel_w +
                                 (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 3) &&
                       (*(int *)((long)&in_RDI->kernel_h +
                                (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 3)) &&
                      ((*(int *)((long)&in_RDI->stride_w +
                                (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 2 &&
                       (*(int *)((long)&in_RDI->stride_h +
                                (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 2)))) {
                pooling3x3s2_max_pack4_sse
                          (in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0,
                           in_stack_fffffffffffff1b8);
              }
              else {
                for (local_bb8 = 0; local_bb8 < local_9c0; local_bb8 = local_bb8 + 1) {
                  local_c08 = (void *)((long)in_RDX->data +
                                      in_RDX->cstep * (long)local_bb8 * in_RDX->elemsize);
                  local_c30 = in_RDX->allocator;
                  local_c50 = 0;
                  local_c40 = 0;
                  local_c38 = 0;
                  local_c28 = 0;
                  local_c24 = 0;
                  local_c20 = 0;
                  local_c1c = 0;
                  local_c18 = 0;
                  local_c10 = 0;
                  local_c48 = 0;
                  for (local_c54 = 0; local_c54 < local_b74; local_c54 = local_c54 + 1) {
                    for (local_c58 = 0; local_c58 < local_b70; local_c58 = local_c58 + 1) {
                      local_c60 = (undefined8 *)
                                  ((long)local_b68 +
                                  (long)(local_c58 *
                                         *(int *)((long)&in_RDI->stride_w +
                                                 (long)(in_RDI->super_Layer)._vptr_Layer[-3]) * 4) *
                                  4 + (long)local_b3c *
                                      (long)(local_c54 *
                                            *(int *)((long)&in_RDI->stride_h +
                                                    (long)(in_RDI->super_Layer)._vptr_Layer[-3])) *
                                      local_b58 + local_b28 * local_bb8 * local_b58);
                      local_c78 = *local_c60;
                      uStack_c70 = local_c60[1];
                      for (local_c7c = 0; local_c7c < local_b78; local_c7c = local_c7c + 1) {
                        pauVar6 = (undefined1 (*) [16])
                                  ((long)local_c60 + (long)(local_ba0[local_c7c] << 2) * 4);
                        local_c98 = *(undefined8 *)*pauVar6;
                        uStack_c90 = *(undefined8 *)(*pauVar6 + 8);
                        auVar9._8_8_ = uStack_c70;
                        auVar9._0_8_ = local_c78;
                        auVar9 = maxps(auVar9,*pauVar6);
                        local_c78 = auVar9._0_8_;
                        uStack_c70 = auVar9._8_8_;
                      }
                      puVar5 = (undefined8 *)((long)local_c08 + (long)(local_c58 << 2) * 4);
                      *puVar5 = local_c78;
                      puVar5[1] = uStack_c70;
                    }
                    local_c08 = (void *)((long)local_c08 + (long)(local_b70 << 2) * 4);
                  }
                  local_be0 = local_b48;
                  local_c00 = 0;
                  local_bf0 = 0;
                  local_be8 = 0;
                  local_bd8 = 0;
                  local_bd4 = 0;
                  local_bd0 = 0;
                  local_bcc = 0;
                  local_bc8 = 0;
                  local_bc0 = 0;
                  local_bf8 = 0;
                }
              }
            }
            else if (*(int *)((long)&in_RDI->pooling_type +
                             (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 1) {
              if (*(int *)((long)&in_RDI->avgpool_count_include_pad +
                          (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 0) {
                local_c9c = 0;
                local_ca0 = 0;
                if (*(int *)((long)&in_RDI->pad_mode + (long)(in_RDI->super_Layer)._vptr_Layer[-3])
                    == 0) {
                  local_c9c = ((local_b3c - in_RSI->w) -
                              *(int *)((long)&in_RDI->pad_left +
                                      (long)(in_RDI->super_Layer)._vptr_Layer[-3])) -
                              *(int *)((long)&in_RDI->pad_right +
                                      (long)(in_RDI->super_Layer)._vptr_Layer[-3]);
                  local_ca0 = ((local_b38 - in_RSI->h) -
                              *(int *)((long)&in_RDI->pad_top +
                                      (long)(in_RDI->super_Layer)._vptr_Layer[-3])) -
                              *(int *)((long)&in_RDI->pad_bottom +
                                      (long)(in_RDI->super_Layer)._vptr_Layer[-3]);
                }
                for (local_ca4 = 0; local_ca4 < local_9c0; local_ca4 = local_ca4 + 1) {
                  local_cf8 = (void *)((long)in_RDX->data +
                                      in_RDX->cstep * (long)local_ca4 * in_RDX->elemsize);
                  local_d20 = in_RDX->allocator;
                  local_cd0 = local_b48;
                  local_d40 = 0;
                  local_d30 = 0;
                  local_d28 = 0;
                  local_d18 = 0;
                  local_d14 = 0;
                  local_d10 = 0;
                  local_d0c = 0;
                  local_d08 = 0;
                  local_d00 = 0;
                  local_d38 = 0;
                  for (local_d44 = 0; local_d44 < local_b74; local_d44 = local_d44 + 1) {
                    local_d48 = local_d44 *
                                *(int *)((long)&in_RDI->stride_h +
                                        (long)(in_RDI->super_Layer)._vptr_Layer[-3]);
                    for (local_d4c = 0; local_d4c < local_b70; local_d4c = local_d4c + 1) {
                      local_d50 = local_d4c *
                                  *(int *)((long)&in_RDI->stride_w +
                                          (long)(in_RDI->super_Layer)._vptr_Layer[-3]);
                      local_d68 = 0;
                      uStack_d60 = 0;
                      local_d6c = 0;
                      for (local_d70 = 0;
                          local_d70 <
                          *(int *)((long)&in_RDI->kernel_h +
                                  (long)(in_RDI->super_Layer)._vptr_Layer[-3]);
                          local_d70 = local_d70 + 1) {
                        local_d74 = local_d48 + local_d70;
                        if (*(int *)((long)&in_RDI->pad_top +
                                    (long)(in_RDI->super_Layer)._vptr_Layer[-3]) <= local_d74) {
                          if ((local_9bc -
                              *(int *)((long)&in_RDI->pad_bottom +
                                      (long)(in_RDI->super_Layer)._vptr_Layer[-3])) - local_ca0 <=
                              local_d74) break;
                          for (local_d78 = 0;
                              local_d78 <
                              *(int *)((long)&in_RDI->kernel_w +
                                      (long)(in_RDI->super_Layer)._vptr_Layer[-3]);
                              local_d78 = local_d78 + 1) {
                            local_d7c = local_d50 + local_d78;
                            if (*(int *)((long)&in_RDI->pad_left +
                                        (long)(in_RDI->super_Layer)._vptr_Layer[-3]) <= local_d7c) {
                              if ((local_9b8 -
                                  *(int *)((long)&in_RDI->pad_right +
                                          (long)(in_RDI->super_Layer)._vptr_Layer[-3])) - local_c9c
                                  <= local_d7c) break;
                              puVar5 = (undefined8 *)
                                       ((long)local_b68 +
                                       (long)(local_d7c * 4) * 4 +
                                       (long)local_b3c * (long)local_d74 * local_b58 +
                                       local_b28 * local_ca4 * local_b58);
                              local_d98 = *puVar5;
                              uStack_d90 = puVar5[1];
                              local_658 = (float)local_d68;
                              fStack_654 = (float)((ulong)local_d68 >> 0x20);
                              fStack_650 = (float)uStack_d60;
                              fStack_64c = (float)((ulong)uStack_d60 >> 0x20);
                              local_668 = (float)local_d98;
                              fStack_664 = (float)((ulong)local_d98 >> 0x20);
                              fStack_660 = (float)uStack_d90;
                              fStack_65c = (float)((ulong)uStack_d90 >> 0x20);
                              local_d68 = CONCAT44(fStack_654 + fStack_664,local_658 + local_668);
                              uStack_d60 = CONCAT44(fStack_64c + fStack_65c,fStack_650 + fStack_660)
                              ;
                              local_d6c = local_d6c + 1;
                            }
                          }
                        }
                      }
                      fVar8 = 1.0 / (float)local_d6c;
                      local_da8 = CONCAT44(fVar8,fVar8);
                      uStack_da0 = CONCAT44(fVar8,fVar8);
                      local_5f8 = (float)local_d68;
                      fStack_5f4 = (float)((ulong)local_d68 >> 0x20);
                      fStack_5f0 = (float)uStack_d60;
                      fStack_5ec = (float)((ulong)uStack_d60 >> 0x20);
                      local_db8 = CONCAT44(fStack_5f4 * fVar8,local_5f8 * fVar8);
                      uStack_db0 = CONCAT44(fStack_5ec * fVar8,fStack_5f0 * fVar8);
                      puVar5 = (undefined8 *)((long)local_cf8 + (long)(local_d4c << 2) * 4);
                      *puVar5 = local_db8;
                      puVar5[1] = uStack_db0;
                    }
                    local_cf8 = (void *)((long)local_cf8 + (long)(local_b70 << 2) * 4);
                  }
                  local_cf0 = 0;
                  local_ce0 = 0;
                  local_cd8 = 0;
                  local_cc8 = 0;
                  local_cc4 = 0;
                  local_cc0 = 0;
                  local_cbc = 0;
                  local_cb8 = 0;
                  local_cb0 = 0;
                  local_ce8 = 0;
                }
              }
              else {
                for (local_dbc = 0; local_dbc < local_9c0; local_dbc = local_dbc + 1) {
                  local_e10 = (void *)((long)in_RDX->data +
                                      in_RDX->cstep * (long)local_dbc * in_RDX->elemsize);
                  fVar8 = 1.0 / (float)local_b78;
                  for (local_e6c = 0; local_e6c < local_b74; local_e6c = local_e6c + 1) {
                    for (local_e70 = 0; local_e70 < local_b70; local_e70 = local_e70 + 1) {
                      local_e88 = 0.0;
                      fStack_e84 = 0.0;
                      fStack_e80 = 0.0;
                      fStack_e7c = 0.0;
                      for (local_e8c = 0; local_e8c < local_b78; local_e8c = local_e8c + 1) {
                        puVar5 = (undefined8 *)
                                 ((long)local_b68 +
                                 (long)(local_ba0[local_e8c] << 2) * 4 +
                                 (long)(local_e70 *
                                        *(int *)((long)&in_RDI->stride_w +
                                                (long)(in_RDI->super_Layer)._vptr_Layer[-3]) * 4) *
                                 4 + (long)local_b3c *
                                     (long)(local_e6c *
                                           *(int *)((long)&in_RDI->stride_h +
                                                   (long)(in_RDI->super_Layer)._vptr_Layer[-3])) *
                                     local_b58 + local_b28 * local_dbc * local_b58);
                        uVar3 = *puVar5;
                        uVar4 = puVar5[1];
                        local_688 = (float)uVar3;
                        fStack_684 = (float)((ulong)uVar3 >> 0x20);
                        fStack_680 = (float)uVar4;
                        fStack_67c = (float)((ulong)uVar4 >> 0x20);
                        local_e88 = local_e88 + local_688;
                        fStack_e84 = fStack_e84 + fStack_684;
                        fStack_e80 = fStack_e80 + fStack_680;
                        fStack_e7c = fStack_e7c + fStack_67c;
                      }
                      puVar5 = (undefined8 *)((long)local_e10 + (long)(local_e70 << 2) * 4);
                      *puVar5 = CONCAT44(fStack_e84 * fVar8,local_e88 * fVar8);
                      puVar5[1] = CONCAT44(fStack_e7c * fVar8,fStack_e80 * fVar8);
                    }
                    local_e10 = (void *)((long)local_e10 + (long)(local_b70 << 2) * 4);
                  }
                  in_stack_ffffffffffffeeb0 = (allocator_type *)&local_e08;
                  local_de8 = local_b48;
                  local_e08 = 0;
                  local_df8 = 0;
                  local_df0 = 0;
                  local_de0 = 0;
                  local_ddc = 0;
                  local_dd8 = 0;
                  local_dd4 = 0;
                  local_dd0 = 0;
                  local_dc8 = 0;
                  local_e00 = 0;
                }
              }
            }
            local_98c = 0;
            local_b6c = 1;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeeb0);
          }
        }
        if (local_b60 != (int *)0x0) {
          LOCK();
          iVar1 = *local_b60;
          *local_b60 = *local_b60 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_b48 == (long *)0x0) {
              if (local_b68 != (void *)0x0) {
                free(local_b68);
              }
            }
            else {
              (**(code **)(*local_b48 + 0x18))(local_b48,local_b68);
            }
          }
        }
      }
      else {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
                    in_stack_ffffffffffffeecc,
                    CONCAT44(in_stack_ffffffffffffeec4,in_stack_ffffffffffffeec0),
                    in_stack_ffffffffffffeebc,(Allocator *)in_stack_ffffffffffffeeb0);
        bVar7 = true;
        if (in_RDX->data != (void *)0x0) {
          bVar7 = in_RDX->cstep * (long)in_RDX->c == 0;
        }
        if (bVar7) {
          local_98c = -100;
        }
        else {
          local_9b8 = local_9b8 * local_9bc;
          if (*(int *)((long)&in_RDI->pooling_type + (long)(in_RDI->super_Layer)._vptr_Layer[-3]) ==
              0) {
            for (local_9d0 = 0; local_9d0 < local_9c0; local_9d0 = local_9d0 + 1) {
              local_9d8 = (undefined1 (*) [16])
                          ((long)in_RSI->data + in_RSI->cstep * (long)local_9d0 * in_RSI->elemsize);
              local_a48 = *local_9d8;
              local_a4c = 0;
              while( true ) {
                if (local_9b8 <= local_a4c) break;
                local_a48 = maxps(local_a48,*local_9d8);
                local_9d8 = local_9d8 + 1;
                local_a4c = local_a4c + 1;
              }
              puVar5 = (undefined8 *)((long)in_RDX->data + (long)(local_9d0 << 2) * 4);
              *puVar5 = local_a48._0_8_;
              puVar5[1] = local_a48._8_8_;
            }
          }
          else if (*(int *)((long)&in_RDI->pooling_type +
                           (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 1) {
            for (local_a74 = 0; local_a74 < local_9c0; local_a74 = local_a74 + 1) {
              local_a80 = (undefined8 *)
                          ((long)in_RSI->data + in_RSI->cstep * (long)local_a74 * in_RSI->elemsize);
              local_ad8 = 0.0;
              fStack_ad4 = 0.0;
              fStack_ad0 = 0.0;
              fStack_acc = 0.0;
              for (local_adc = 0; local_adc < local_9b8; local_adc = local_adc + 1) {
                local_648 = (float)*local_a80;
                fStack_644 = (float)((ulong)*local_a80 >> 0x20);
                fStack_640 = (float)local_a80[1];
                fStack_63c = (float)((ulong)local_a80[1] >> 0x20);
                local_ad8 = local_ad8 + local_648;
                fStack_ad4 = fStack_ad4 + fStack_644;
                fStack_ad0 = fStack_ad0 + fStack_640;
                fStack_acc = fStack_acc + fStack_63c;
                local_a80 = local_a80 + 2;
              }
              fVar8 = 1.0 / (float)local_9b8;
              puVar5 = (undefined8 *)((long)in_RDX->data + (long)(local_a74 << 2) * 4);
              *puVar5 = CONCAT44(fStack_ad4 * fVar8,local_ad8 * fVar8);
              puVar5[1] = CONCAT44(fStack_acc * fVar8,fStack_ad0 * fVar8);
            }
          }
          local_98c = 0;
        }
      }
    }
    else if ((*(int *)((long)&in_RDI->kernel_w + (long)(in_RDI->super_Layer)._vptr_Layer[-3]) ==
              *(int *)((long)&in_RDI->kernel_h + (long)(in_RDI->super_Layer)._vptr_Layer[-3])) &&
            (*(int *)((long)&in_RDI->stride_w + (long)(in_RDI->super_Layer)._vptr_Layer[-3]) ==
             *(int *)((long)&in_RDI->stride_h + (long)(in_RDI->super_Layer)._vptr_Layer[-3]))) {
      if (((*(int *)((long)&in_RDI->pooling_type + (long)(in_RDI->super_Layer)._vptr_Layer[-3]) == 0
           ) && (*(int *)((long)&in_RDI->stride_w + (long)(in_RDI->super_Layer)._vptr_Layer[-3]) ==
                 2)) &&
         (*(int *)((long)&in_RDI->global_pooling + (long)(in_RDI->super_Layer)._vptr_Layer[-3]) != 1
         )) {
        local_98c = Pooling::forward(in_RDI,in_RSI,in_RDX,in_RCX);
      }
      else {
        local_98c = Pooling::forward(in_RDI,in_RSI,in_RDX,in_RCX);
      }
    }
    else {
      local_98c = Pooling::forward(in_RDI,in_RSI,in_RDX,in_RCX);
    }
  }
  else {
    local_98c = Pooling::forward(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_98c;
}

Assistant:

int Pooling_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

#if __AVX512F__
    if (elempack == 16)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _max = _mm512_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _max = _mm512_max_ps(_max, _val);
                        ptr += 16;
                    }

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m512 _sum = _mm512_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m512 _val = _mm512_loadu_ps(ptr);
                        _sum = _mm512_add_ps(_sum, _val);
                        ptr += 16;
                    }

                    __m512 _inv_size = _mm512_set1_ps(1.f / size);
                    __m512 _avg = _mm512_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm512_storeu_ps(outptr + q * 16, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack16_avx512(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                        __m512 _max = _mm512_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                            _max = _mm512_max_ps(_max, _val);
                        }

                        _mm512_storeu_ps(outptr, _max);
                        outptr += 16;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m512 _sum = _mm512_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m512 _val = _mm512_loadu_ps(m.row(sy) + sx * 16);
                                    _sum = _mm512_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m512 _inv_area = _mm512_set1_ps(1.f / area);
                            __m512 _avg = _mm512_mul_ps(_sum, _inv_area);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m512 _inv_maxk = _mm512_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            __m512 _sum = _mm512_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                _sum = _mm512_add_ps(_sum, _val);
                            }

                            __m512 _avg = _mm512_mul_ps(_sum, _inv_maxk);
                            _mm512_storeu_ps(outptr, _avg);
                            outptr += 16;
                        }
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX512F__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}